

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O2

void GPU_PopMatrix(void)

{
  uint uVar1;
  GPU_Context *pGVar2;
  GPU_Target *pGVar3;
  char *details;
  bool bVar4;
  
  pGVar3 = GPU_GetContextTarget();
  if ((pGVar3 != (GPU_Target *)0x0) && (pGVar3->context != (GPU_Context *)0x0)) {
    GPU_FlushBlitBuffer();
    pGVar2 = pGVar3->context;
    bVar4 = pGVar2->matrix_mode == 0;
    uVar1 = (&pGVar2->projection_matrix)[bVar4].size;
    if (uVar1 == 1) {
      details = "Matrix stack would become empty!";
    }
    else {
      if (uVar1 != 0) {
        (&pGVar2->projection_matrix)[bVar4].size = uVar1 - 1;
        return;
      }
      details = "Matrix stack is empty.";
    }
    GPU_PushErrorCode("GPU_PopMatrix",GPU_ERROR_USER_ERROR,details);
    return;
  }
  return;
}

Assistant:

void GPU_PopMatrix(void)
{
    GPU_Target* target = GPU_GetContextTarget();
	GPU_MatrixStack* stack;

    if(target == NULL || target->context == NULL)
        return;
        
	GPU_FlushBlitBuffer();
    stack = (target->context->matrix_mode == GPU_MODELVIEW? &target->context->modelview_matrix : &target->context->projection_matrix);
    if(stack->size == 0)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_USER_ERROR, "Matrix stack is empty.");
    }
    else if(stack->size == 1)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_USER_ERROR, "Matrix stack would become empty!");
    }
    else
        stack->size--;
}